

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_int32 *
drwav_open_memory_and_read_pcm_frames_s32
          (void *data,size_t dataSize,uint *channelsOut,uint *sampleRateOut,
          drwav_uint64 *totalFrameCountOut,drwav_allocation_callbacks *pAllocationCallbacks)

{
  drwav_bool32 dVar1;
  drwav_int32 *pdVar2;
  drwav wav;
  drwav local_1d8;
  
  if (channelsOut != (uint *)0x0) {
    *channelsOut = 0;
  }
  if (sampleRateOut != (uint *)0x0) {
    *sampleRateOut = 0;
  }
  if (totalFrameCountOut != (drwav_uint64 *)0x0) {
    *totalFrameCountOut = 0;
  }
  pdVar2 = (drwav_int32 *)0x0;
  dVar1 = drwav_init_memory_ex
                    (&local_1d8,data,dataSize,(drwav_chunk_proc)0x0,(void *)0x0,0,
                     pAllocationCallbacks);
  if (dVar1 != 0) {
    pdVar2 = drwav__read_pcm_frames_and_close_s32
                       (&local_1d8,channelsOut,sampleRateOut,totalFrameCountOut);
  }
  return pdVar2;
}

Assistant:

DRWAV_API drwav_int32* drwav_open_memory_and_read_pcm_frames_s32(const void* data, size_t dataSize, unsigned int* channelsOut, unsigned int* sampleRateOut, drwav_uint64* totalFrameCountOut, const drwav_allocation_callbacks* pAllocationCallbacks)
{
    drwav wav;

    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalFrameCountOut) {
        *totalFrameCountOut = 0;
    }

    if (!drwav_init_memory(&wav, data, dataSize, pAllocationCallbacks)) {
        return NULL;
    }

    return drwav__read_pcm_frames_and_close_s32(&wav, channelsOut, sampleRateOut, totalFrameCountOut);
}